

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sunlinsol_spgmr.c
# Opt level: O2

SUNErrCode SUNLinSolInitialize_SPGMR(SUNLinearSolver S)

{
  int *piVar1;
  undefined8 uVar2;
  void *pvVar3;
  long lVar4;
  long lVar5;
  
  piVar1 = (int *)S->content;
  if (piVar1[3] < 0) {
    piVar1[3] = 0;
  }
  if (2 < piVar1[1] - 1U) {
    piVar1[1] = 0;
  }
  if (*(long *)(piVar1 + 0x18) == 0) {
    uVar2 = N_VCloneVectorArray(*piVar1 + 1,*(undefined8 *)(piVar1 + 0x22));
    *(undefined8 *)(piVar1 + 0x18) = uVar2;
  }
  if (*(long *)(piVar1 + 0x1a) == 0) {
    lVar5 = (long)*piVar1;
    pvVar3 = malloc(lVar5 * 8 + 8);
    *(void **)(piVar1 + 0x1a) = pvVar3;
    for (lVar4 = 0; lVar4 <= lVar5; lVar4 = lVar4 + 1) {
      *(undefined8 *)(*(long *)(piVar1 + 0x1a) + lVar4 * 8) = 0;
      pvVar3 = malloc(lVar5 * 8);
      *(void **)(*(long *)(piVar1 + 0x1a) + lVar4 * 8) = pvVar3;
    }
  }
  if (*(long *)(piVar1 + 0x1c) == 0) {
    pvVar3 = malloc((long)*piVar1 << 4);
    *(void **)(piVar1 + 0x1c) = pvVar3;
  }
  if (*(long *)(piVar1 + 0x20) == 0) {
    pvVar3 = malloc((long)*piVar1 * 8 + 8);
    *(void **)(piVar1 + 0x20) = pvVar3;
  }
  if (*(long *)(piVar1 + 0x24) == 0) {
    pvVar3 = malloc((long)*piVar1 * 8 + 8);
    *(void **)(piVar1 + 0x24) = pvVar3;
  }
  if (*(long *)(piVar1 + 0x26) == 0) {
    pvVar3 = malloc((long)*piVar1 * 8 + 8);
    *(void **)(piVar1 + 0x26) = pvVar3;
  }
  return 0;
}

Assistant:

SUNErrCode SUNLinSolInitialize_SPGMR(SUNLinearSolver S)
{
  int k;
  SUNLinearSolverContent_SPGMR content;
  SUNFunctionBegin(S->sunctx);

  /* set shortcut to SPGMR memory structure */
  content = SPGMR_CONTENT(S);

  /* ensure valid options */
  if (content->max_restarts < 0)
  {
    content->max_restarts = SUNSPGMR_MAXRS_DEFAULT;
  }

  SUNAssert(content->ATimes, SUN_ERR_ARG_CORRUPT);

  if ((content->pretype != SUN_PREC_LEFT) &&
      (content->pretype != SUN_PREC_RIGHT) && (content->pretype != SUN_PREC_BOTH))
  {
    content->pretype = SUN_PREC_NONE;
  }

  SUNAssert((content->pretype == SUN_PREC_NONE) || (content->Psolve != NULL),
            SUN_ERR_ARG_CORRUPT);

  /* allocate solver-specific memory (where the size depends on the
     choice of maxl) here */

  /*   Krylov subspace vectors */
  if (content->V == NULL)
  {
    content->V = N_VCloneVectorArray(content->maxl + 1, content->vtemp);
    SUNCheckLastErr();
  }

  /*   Hessenberg matrix Hes */
  if (content->Hes == NULL)
  {
    content->Hes =
      (sunrealtype**)malloc((content->maxl + 1) * sizeof(sunrealtype*));
    SUNAssert(content->Hes, SUN_ERR_MALLOC_FAIL);

    for (k = 0; k <= content->maxl; k++)
    {
      content->Hes[k] = NULL;
      content->Hes[k] = (sunrealtype*)malloc(content->maxl * sizeof(sunrealtype));
      SUNAssert(content->Hes[k], SUN_ERR_MALLOC_FAIL);
    }
  }

  /*   Givens rotation components */
  if (content->givens == NULL)
  {
    content->givens =
      (sunrealtype*)malloc(2 * content->maxl * sizeof(sunrealtype));
    SUNAssert(content->givens, SUN_ERR_MALLOC_FAIL);
  }

  /*    y and g vectors */
  if (content->yg == NULL)
  {
    content->yg = (sunrealtype*)malloc((content->maxl + 1) * sizeof(sunrealtype));
    SUNAssert(content->yg, SUN_ERR_MALLOC_FAIL);
  }

  /*    cv vector for fused vector ops */
  if (content->cv == NULL)
  {
    content->cv = (sunrealtype*)malloc((content->maxl + 1) * sizeof(sunrealtype));
    SUNAssert(content->cv, SUN_ERR_MALLOC_FAIL);
  }

  /*    Xv vector for fused vector ops */
  if (content->Xv == NULL)
  {
    content->Xv = (N_Vector*)malloc((content->maxl + 1) * sizeof(N_Vector));
    SUNAssert(content->Xv, SUN_ERR_MALLOC_FAIL);
  }

  return SUN_SUCCESS;
}